

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

int main(int argc,char **argv)

{
  short sVar1;
  pointer pbVar2;
  ostream *poVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  mapped_type *pmVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> marker_name;
  value_type c3d_data;
  value_type reference_data;
  C3DFile c3dfile;
  C3DFile reference_file;
  key_type local_700;
  FloatMarkerData local_6e0;
  FloatMarkerData local_668;
  C3DFile local_5f0;
  C3DFile local_310;
  
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5f0.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_5f0.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5f0.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_310.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.param_infos.super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.group_infos.super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.point_data.
  super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.point_label.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_310.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.float_point_data.super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5f0.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5f0.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_310.label_point_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_310.group_id_to_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  C3DFile::load(&local_310,"../data/slackline0000_all_written.c3d");
  C3DFile::load(&local_5f0,"../data/slackline0000_all.c3d");
  poVar3 = std::operator<<((ostream *)&std::cout,"Value Name");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = std::operator<<(poVar3,"Original");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Reference");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header first");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.first_parameter);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.first_parameter);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header id");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.c3d_id);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.c3d_id);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header Num Mark");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.num_markers);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.num_markers);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header Ana Chan");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.analog_channels);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.analog_channels);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header 1. frame");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.first_frame);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.first_frame);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header last frame");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.last_frame);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.last_frame);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header max int gap");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.max_interpolation_gap);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.max_interpolation_gap);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header scale_factor");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5f0.header.scale_factor);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_310.header.scale_factor);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header start rec");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.start_record);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.start_record);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header ana cha sam");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(uint)local_5f0.header.analog_channels_samples);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(uint)local_310.header.analog_channels_samples);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header vid sam ra");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5f0.header.video_sampling_rate);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_310.header.video_sampling_rate);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header key val la");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.key_value_label);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.key_value_label);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header bl lab strt");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.block_label_start);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.block_label_start);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header 4 events");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(uint)local_5f0.header.key_value_char_4_events);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(uint)local_310.header.key_value_char_4_events);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header num evnt");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_5f0.header.num_events);
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_310.header.num_events);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<(poVar3,"Marker_name");
  poVar3 = std::operator<<(poVar3,"\tLoaded Values");
  poVar3 = std::operator<<(poVar3,"\tReference Values");
  std::endl<char,std::char_traits<char>>(poVar3);
  pbVar2 = local_310.point_label.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = local_310.point_label.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
    std::__cxx11::string::string((string *)&local_700,(string *)pbVar6);
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (local_5f0.point_label.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_5f0.point_label.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_700);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
             ::operator[](&local_310.label_point_map,&local_700);
    sVar1 = *pmVar5;
    FloatMarkerData::FloatMarkerData
              (&local_668,
               local_310.float_point_data.
               super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
               super__Vector_impl_data._M_start + sVar1);
    if (_Var4._M_current ==
        local_5f0.point_label.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Dafug Happend ");
      poVar3 = std::operator<<(poVar3,(string *)&local_700);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
      ::operator[](&local_5f0.label_point_map,&local_700);
      FloatMarkerData::FloatMarkerData
                (&local_6e0,
                 local_5f0.float_point_data.
                 super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                 super__Vector_impl_data._M_start + sVar1);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "------------------------------------------------------------------------------"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"\t\t");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*local_6e0.x.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*local_668.x.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_700);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*local_6e0.y.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*local_668.y.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"\t\t");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*local_6e0.z.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*local_668.z.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "------------------------------------------------------------------------------"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      FloatMarkerData::~FloatMarkerData(&local_6e0);
    }
    FloatMarkerData::~FloatMarkerData(&local_668);
    std::__cxx11::string::~string((string *)&local_700);
  }
  C3DFile::~C3DFile(&local_310);
  C3DFile::~C3DFile(&local_5f0);
  return 0;
}

Assistant:

int main (int argc, char *argv[])
{
	const char* reference = "../data/slackline0000_all_written.c3d";
	const char* xsens_c3d = "../data/slackline0000_all.c3d";
	C3DFile c3dfile, reference_file;
	reference_file.load (reference);
	c3dfile.load (xsens_c3d);
	

	cout << "Value Name" << "\t\t" << "Original" << "\t" << "Reference" << endl;
	//compare header
	cout << "Header first" << "\t\t" << (int)c3dfile.header.first_parameter << "\t\t" << (int)reference_file.header.first_parameter << endl;
	cout << "Header id" << "\t\t" << (int)c3dfile.header.c3d_id<< "\t\t" << (int)reference_file.header.c3d_id<< endl;
	cout << "Header Num Mark" << "\t\t" << (int)c3dfile.header.num_markers<< "\t\t" << (int)reference_file.header.num_markers<< endl;
	cout << "Header Ana Chan" << "\t\t" << (int)c3dfile.header.analog_channels<< "\t\t" << (int)reference_file.header.analog_channels<< endl;
	cout << "Header 1. frame" << "\t\t" << (int)c3dfile.header.first_frame<< "\t\t" << (int)reference_file.header.first_frame<< endl;
	cout << "Header last frame" << "\t" << (int)c3dfile.header.last_frame<< "\t\t" << (int)reference_file.header.last_frame<< endl;
	cout << "Header max int gap" << "\t" << (int)c3dfile.header.max_interpolation_gap<< "\t\t" << (int)reference_file.header.max_interpolation_gap<< endl;
	cout << "Header scale_factor" << "\t" << (float)c3dfile.header.scale_factor<< "\t\t" << (float)reference_file.header.scale_factor<< endl;
	cout << "Header start rec" << "\t" << (int)c3dfile.header.start_record<< "\t\t" << (int)reference_file.header.start_record<< endl;
	cout << "Header ana cha sam" << "\t" << (int)c3dfile.header.analog_channels_samples<< "\t\t" << (int)reference_file.header.analog_channels_samples<< endl;
	cout << "Header vid sam ra" << "\t" << (float)c3dfile.header.video_sampling_rate<< "\t\t" << (float)reference_file.header.video_sampling_rate<< endl;
	cout << "Header key val la" << "\t" << (int)c3dfile.header.key_value_label<< "\t\t" << (int)reference_file.header.key_value_label<< endl;
	cout << "Header bl lab strt" << "\t" << (int)c3dfile.header.block_label_start<< "\t\t" << (int)reference_file.header.block_label_start<< endl;
	cout << "Header 4 events" << "\t\t" << (int)c3dfile.header.key_value_char_4_events<< "\t\t" << (int)reference_file.header.key_value_char_4_events<< endl;
	cout << "Header num evnt" << "\t\t" << (int)c3dfile.header.num_events<< "\t\t" << (int)reference_file.header.num_events<< endl;

	cout << endl << "Marker_name" << "\tLoaded Values" << "\tReference Values" << endl;

	for (auto marker_name : reference_file.point_label) {
		auto elem = find(c3dfile.point_label.begin(), c3dfile.point_label.end(), marker_name);
		Sint16 pi = reference_file.label_point_map[marker_name];
		auto reference_data = reference_file.float_point_data[pi];
		if( elem != c3dfile.point_label.end() ) {
			Sint16 cpi = c3dfile.label_point_map[marker_name];
			auto c3d_data = c3dfile.float_point_data[pi];
			cout << "------------------------------------------------------------------------------" << endl;
			cout << "\t\t"<< c3d_data.x[0] << "\t" << reference_data.x[0] << endl;
			cout << marker_name << "\t" << c3d_data.y[0] << "\t" << reference_data.y[0] << endl;
			cout << "\t\t"<< c3d_data.z[0] << "\t" << reference_data.z[0] << endl;
			cout << "------------------------------------------------------------------------------" << endl;
		} else {
			cout << "Dafug Happend "<< marker_name << endl;
		}
	}


	return 0;
}